

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *ptVar3;
  example *peVar4;
  int i;
  float fVar5;
  long lVar6;
  allocator local_99c;
  allocator local_99b;
  allocator local_99a;
  allocator local_999;
  allocator local_998;
  allocator local_997;
  allocator local_996;
  allocator local_995;
  allocator local_994;
  allocator local_993;
  allocator local_992;
  allocator local_991;
  string local_990 [32];
  string local_970;
  string local_950 [32];
  string local_930;
  string local_910 [32];
  string local_8f0;
  string local_8d0 [32];
  string local_8b0;
  string local_890 [32];
  string local_870;
  string local_850 [32];
  string local_830;
  string local_810;
  option_group_definition new_options;
  wclass default_wclass;
  undefined1 local_710 [112];
  bool local_6a0;
  typed_option<unsigned_long> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<float> local_350;
  typed_option<bool> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0x70);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  location[3] = 0.0;
  location[4] = 0.0;
  location[5] = 0.0;
  location[6] = 0.0;
  location[7] = 0.0;
  location[8] = 0.0;
  location[9] = 0.0;
  location[10] = 0.0;
  location[0xb] = 0.0;
  location[0xc] = 0.0;
  location[0xd] = 0.0;
  location[0xe] = 0.0;
  location[0xf] = 0.0;
  location[0x10] = 0.0;
  location[0x11] = 0.0;
  location[0x12] = 0.0;
  location[0x13] = 0.0;
  location[0x14] = 0.0;
  location[0x15] = 0.0;
  location[0x16] = 0.0;
  location[0x17] = 0.0;
  location[0x18] = 0.0;
  location[0x19] = 0.0;
  location[0x1a] = 0.0;
  location[0x1b] = 0.0;
  sch->task_data = location;
  std::__cxx11::string::string
            ((string *)&local_810,"Entity Relation Options",(allocator *)&default_wclass);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::string((string *)&local_830,"relation_cost",&local_991);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&default_wclass,&local_830,location + 2);
  ptVar1 = VW::config::typed_option<float>::default_value
                     ((typed_option<float> *)&default_wclass,1.0);
  std::__cxx11::string::string(local_850,"Relation Cost",&local_992);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_d0,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(&new_options,&local_d0);
  std::__cxx11::string::string((string *)&local_870,"entity_cost",&local_993);
  VW::config::typed_option<float>::typed_option(&local_210,&local_870,location + 1);
  local_210.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  std::__cxx11::string::string(local_890,"Entity Cost",&local_994);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_170);
  std::__cxx11::string::string((string *)&local_8b0,"constraints",&local_995);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_8b0,(bool *)(location + 4));
  local_6a0 = true;
  std::__cxx11::string::string(local_8d0,"Use Constraints",&local_996);
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_710);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_2b0);
  std::__cxx11::string::string((string *)&local_8f0,"relation_none_cost",&local_997);
  VW::config::typed_option<float>::typed_option(&local_3f0,&local_8f0,location);
  local_3f0.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_3f0,0.5);
  std::__cxx11::string::string(local_910,"None Relation Cost",&local_998);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_350);
  std::__cxx11::string::string((string *)&local_930,"skip_cost",&local_999);
  VW::config::typed_option<float>::typed_option(&local_530,&local_930,location + 3);
  local_530.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_530,0.01);
  std::__cxx11::string::string(local_950,"Skip Cost (only used when search_order = skip",&local_99a)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_490,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_490);
  std::__cxx11::string::string((string *)&local_970,"search_order",&local_99b);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_670,&local_970,(unsigned_long *)(location + 0x16));
  local_670.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value(&local_670,0);
  std::__cxx11::string::string
            (local_990,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",&local_99c);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_5d0,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_5d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_5d0);
  std::__cxx11::string::~string(local_990);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_670);
  std::__cxx11::string::~string((string *)&local_970);
  VW::config::typed_option<float>::~typed_option(&local_490);
  std::__cxx11::string::~string(local_950);
  VW::config::typed_option<float>::~typed_option(&local_530);
  std::__cxx11::string::~string((string *)&local_930);
  VW::config::typed_option<float>::~typed_option(&local_350);
  std::__cxx11::string::~string(local_910);
  VW::config::typed_option<float>::~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  VW::config::typed_option<bool>::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_8d0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_710);
  std::__cxx11::string::~string((string *)&local_8b0);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_890);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&local_870);
  VW::config::typed_option<float>::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_850);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&default_wclass);
  std::__cxx11::string::~string((string *)&local_830);
  (**options->_vptr_options_i)(options);
  for (fVar5 = 1.4013e-45; fVar5 != 7.00649e-45; fVar5 = (float)((int)fVar5 + 1)) {
    default_wclass.x = fVar5;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)(location + 6),(uint *)&default_wclass);
  }
  for (fVar5 = 7.00649e-45; fVar5 != 1.54143e-44; fVar5 = (float)((int)fVar5 + 1)) {
    default_wclass.x = fVar5;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)(location + 0xe),(uint *)&default_wclass);
  }
  *(undefined1 *)((long)location + 0x11) = 0;
  if (*(long *)(location + 0x16) - 3U < 2) {
    peVar4 = VW::alloc_examples(0x20,10);
    default_wclass.x = 0.0;
    default_wclass.class_index = 0;
    default_wclass.partial_prediction = 0.0;
    default_wclass.wap_value = 0.0;
    for (lVar6 = 0x6828; lVar6 != 0x48048; lVar6 = lVar6 + 0x68d0) {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 ((long)(peVar4->super_example_predict).feature_space + lVar6 + -0x20),
                 &default_wclass);
    }
    *(example **)(location + 0x18) = peVar4;
    *(example **)(location + 0x1a) = peVar4 + 4;
    Search::search::set_options(sch,Search::IS_LDF);
  }
  else {
    Search::search::set_options(sch,0);
  }
  Search::search::set_num_learners(sch,2);
  if (*(unsigned_long *)(location + 0x16) == 4) {
    Search::search::set_num_learners(sch,3);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}